

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O2

void Ssc_GiaSavePiPattern(Gia_Man_t *p,Vec_Int_t *vPat)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  word *pwVar4;
  int iVar5;
  
  iVar3 = vPat->nSize;
  if (iVar3 != p->vCis->nSize) {
    __assert_fail("Vec_IntSize(vPat) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                  ,0x99,"void Ssc_GiaSavePiPattern(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar5 = p->iPatsPi;
  iVar2 = (p->vSimsPi->nSize / (iVar3 - p->nRegs)) * 0x40;
  if (iVar5 == iVar2) {
    Vec_WrdDoubleSimInfo(p->vSimsPi,iVar3);
    iVar5 = p->iPatsPi;
    iVar2 = p->vSimsPi->nSize / (p->vCis->nSize - p->nRegs) << 6;
  }
  if (iVar5 < iVar2) {
    pwVar4 = Gia_ObjSimPi(p,0);
    iVar3 = p->vCis->nSize;
    for (iVar5 = 0; iVar5 < iVar3; iVar5 = iVar5 + 1) {
      iVar3 = Vec_IntEntry(vPat,iVar5);
      if (iVar3 != 0) {
        puVar1 = (uint *)((long)pwVar4 + (long)(p->iPatsPi >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)p->iPatsPi & 0x1f);
      }
      iVar3 = p->vCis->nSize;
      pwVar4 = pwVar4 + p->vSimsPi->nSize / (iVar3 - p->nRegs);
    }
    p->iPatsPi = p->iPatsPi + 1;
    return;
  }
  __assert_fail("p->iPatsPi < 64 * Gia_ObjSimWords(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                ,0x9c,"void Ssc_GiaSavePiPattern(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void Ssc_GiaSavePiPattern( Gia_Man_t * p, Vec_Int_t * vPat )
{
    word * pSimPi;
    int i;
    assert( Vec_IntSize(vPat) == Gia_ManCiNum(p) );
    if ( p->iPatsPi == 64 * Gia_ObjSimWords(p) )
        Vec_WrdDoubleSimInfo( p->vSimsPi, Gia_ManCiNum(p) );
    assert( p->iPatsPi < 64 * Gia_ObjSimWords(p) );
    pSimPi = Gia_ObjSimPi( p, 0 );
    for ( i = 0; i < Gia_ManCiNum(p); i++, pSimPi += Gia_ObjSimWords(p) )
        if ( Vec_IntEntry(vPat, i) )
            Abc_InfoSetBit( (unsigned *)pSimPi, p->iPatsPi );
    p->iPatsPi++;
}